

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx512.cpp
# Opt level: O3

int ncnn::binary_op_2_3_4_20<ncnn::BinaryOp_x86_avx512_functor::binary_op_mul>
              (Mat *a,Mat *b,Mat *c,Option *opt)

{
  uint uVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  ulong uVar8;
  undefined1 (*pauVar9) [64];
  uint uVar10;
  undefined1 (*pauVar11) [64];
  int iVar12;
  uint uVar13;
  uint uVar14;
  long lVar15;
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  float fVar18;
  undefined4 in_register_0000129c;
  
  uVar1 = b->c;
  uVar10 = b->h * b->w * b->d * b->elempack;
  Mat::create_like(c,b,(Allocator *)opt);
  iVar12 = -100;
  if ((c->data != (void *)0x0) && ((long)c->c * c->cstep != 0)) {
    if (0 < (int)uVar1) {
      uVar8 = 0;
      do {
        pauVar9 = (undefined1 (*) [64])(b->cstep * uVar8 * b->elemsize + (long)b->data);
        pauVar11 = (undefined1 (*) [64])(c->cstep * uVar8 * c->elemsize + (long)c->data);
        auVar16 = vbroadcastss_avx512f(ZEXT416(*a->data));
        if ((int)uVar10 < 0x10) {
          uVar14 = 0;
        }
        else {
          iVar12 = 0xf;
          do {
            auVar17 = vmulps_avx512f(auVar16,*pauVar9);
            *pauVar11 = auVar17;
            pauVar9 = pauVar9 + 1;
            pauVar11 = pauVar11 + 1;
            iVar12 = iVar12 + 0x10;
            uVar14 = uVar10 & 0xfffffff0;
          } while (iVar12 < (int)uVar10);
        }
        fVar18 = auVar16._0_4_;
        uVar13 = uVar14 | 7;
        while ((int)uVar13 < (int)uVar10) {
          fVar2 = *(float *)(*pauVar9 + 4);
          fVar3 = *(float *)(*pauVar9 + 8);
          fVar4 = *(float *)(*pauVar9 + 0xc);
          fVar5 = *(float *)(*pauVar9 + 0x10);
          fVar6 = *(float *)(*pauVar9 + 0x14);
          fVar7 = *(float *)(*pauVar9 + 0x18);
          *(float *)*pauVar11 = fVar18 * *(float *)*pauVar9;
          *(float *)((long)*pauVar11 + 4) = fVar18 * fVar2;
          *(float *)((long)*pauVar11 + 8) = fVar18 * fVar3;
          *(float *)((long)*pauVar11 + 0xc) = fVar18 * fVar4;
          *(float *)((long)*pauVar11 + 0x10) = fVar18 * fVar5;
          *(float *)((long)*pauVar11 + 0x14) = fVar18 * fVar6;
          *(float *)((long)*pauVar11 + 0x18) = fVar18 * fVar7;
          *(undefined4 *)((long)*pauVar11 + 0x1c) = in_register_0000129c;
          pauVar9 = (undefined1 (*) [64])(*pauVar9 + 0x20);
          pauVar11 = (undefined1 (*) [64])((long)*pauVar11 + 0x20);
          uVar13 = uVar14 + 0xf;
          uVar14 = uVar14 + 8;
        }
        uVar13 = uVar14 | 3;
        while ((int)uVar13 < (int)uVar10) {
          fVar2 = *(float *)(*pauVar9 + 4);
          fVar3 = *(float *)(*pauVar9 + 8);
          fVar4 = *(float *)(*pauVar9 + 0xc);
          in_register_0000129c = 0;
          *(float *)*pauVar11 = fVar18 * *(float *)*pauVar9;
          *(float *)((long)*pauVar11 + 4) = fVar18 * fVar2;
          *(float *)((long)*pauVar11 + 8) = fVar18 * fVar3;
          *(float *)((long)*pauVar11 + 0xc) = fVar18 * fVar4;
          pauVar9 = (undefined1 (*) [64])(*pauVar9 + 0x10);
          pauVar11 = (undefined1 (*) [64])((long)*pauVar11 + 0x10);
          uVar13 = uVar14 + 7;
          uVar14 = uVar14 + 4;
        }
        if (uVar10 - uVar14 != 0 && (int)uVar14 <= (int)uVar10) {
          lVar15 = 0;
          do {
            *(float *)((long)*pauVar11 + lVar15 * 4) = fVar18 * *(float *)(*pauVar9 + lVar15 * 4);
            lVar15 = lVar15 + 1;
          } while (uVar10 - uVar14 != (int)lVar15);
        }
        uVar8 = uVar8 + 1;
      } while (uVar8 != uVar1);
    }
    iVar12 = 0;
  }
  return iVar12;
}

Assistant:

static int binary_op_2_3_4_20(const Mat& a, const Mat& b, Mat& c, const Option& opt)
{
    Op op;

    int w = b.w;
    int h = b.h;
    int d = b.d;
    int channels = b.c;
    int elempack = b.elempack;
    int size = w * h * d * elempack;

    // type 2 3 4 20
    c.create_like(b, opt.blob_allocator);
    if (c.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float a0 = a[0];
        const float* ptr = b.channel(q);
        float* outptr = c.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _a0_avx512 = _mm512_set1_ps(a0);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _outp = op.func_pack16(_a0_avx512, _p);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            outptr += 16;
        }
#endif // __AVX512F__
        __m256 _a0_avx = _mm256_set1_ps(a0);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _outp = op.func_pack8(_a0_avx, _p);
            _mm256_storeu_ps(outptr, _outp);
            ptr += 8;
            outptr += 8;
        }
#endif // __AVX__
        __m128 _a0 = _mm_set1_ps(a0);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 _outp = op.func_pack4(_a0, _p);
            _mm_store_ps(outptr, _outp);
            ptr += 4;
            outptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *outptr = op.func(a0, *ptr);
            ptr += 1;
            outptr += 1;
        }
    }

    return 0;
}